

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

int __thiscall cmCTestMemCheckHandler::PreProcessHandler(cmCTestMemCheckHandler *this)

{
  cmCTest *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  ostringstream cmCTestLog_msg;
  long *local_1a8;
  long local_198 [2];
  long local_188 [14];
  ios_base local_118 [264];
  
  bVar1 = InitializeMemoryChecking(this);
  iVar2 = 0;
  if (bVar1) {
    iVar3 = cmCTestTestHandler::ExecuteCommands
                      (&this->super_cmCTestTestHandler,&this->CustomPreMemCheck);
    iVar2 = 1;
    if (iVar3 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_188,"Problem executing pre-memcheck command(s).",0x2a);
      std::ios::widen((char)(ostringstream *)local_188 + (char)*(undefined8 *)(local_188[0] + -0x18)
                     );
      std::ostream::put((char)local_188);
      std::ostream::flush();
      this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x91,(char *)local_1a8,false);
      if (local_1a8 != local_198) {
        operator_delete(local_1a8,local_198[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
      std::ios_base::~ios_base(local_118);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int cmCTestMemCheckHandler::PreProcessHandler()
{
  if (!this->InitializeMemoryChecking()) {
    return 0;
  }

  if (!this->ExecuteCommands(this->CustomPreMemCheck)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Problem executing pre-memcheck command(s)." << std::endl);
    return 0;
  }
  return 1;
}